

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoInput.cpp
# Opt level: O0

void __thiscall PianoInput::mapBindings(PianoInput *this)

{
  iterator *ppiVar1;
  initializer_list<int> *piVar2;
  const_iterator piVar3;
  initializer_list<int> *piVar4;
  int local_5c;
  int local_58;
  int special;
  int i;
  int semitone;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> local_38;
  initializer_list<int> *local_28;
  initializer_list<int> *__range1;
  iterator iter;
  anon_class_8_1_8991fb9c mapKey;
  PianoInput *this_local;
  
  mapKey.this = this;
  QHash<int,_int>::clear(&this->mBindingLookup);
  iter = (iterator)this;
  __range1 = (initializer_list<int> *)std::array<Qt::Key,_49UL>::begin(&this->mBindings);
  __begin1._0_4_ = 0;
  __begin1._4_4_ = 0xc;
  local_38._M_array = (iterator)&__begin1;
  local_38._M_len = 2;
  local_28 = &local_38;
  __end1 = std::initializer_list<int>::begin(local_28);
  piVar3 = std::initializer_list<int>::end(local_28);
  for (; __end1 != piVar3; __end1 = __end1 + 1) {
    special = *__end1;
    for (local_58 = 0; local_58 < 0x18; local_58 = local_58 + 1) {
      ppiVar1 = &__range1->_M_array;
      __range1 = (initializer_list<int> *)((long)&__range1->_M_array + 4);
      mapBindings::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&iter,*(Key *)ppiVar1,special);
      special = special + 1;
    }
  }
  local_5c = 0x24;
  while( true ) {
    piVar2 = __range1;
    piVar4 = (initializer_list<int> *)std::array<Qt::Key,_49UL>::end(&this->mBindings);
    if (piVar2 == piVar4) break;
    ppiVar1 = &__range1->_M_array;
    __range1 = (initializer_list<int> *)((long)&__range1->_M_array + 4);
    mapBindings::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&iter,*(Key *)ppiVar1,local_5c);
    local_5c = local_5c + 1;
  }
  return;
}

Assistant:

void PianoInput::mapBindings() {
    mBindingLookup.clear();

    auto mapKey = [this](Qt::Key key, int semitone) {
        if (key != NoKey) {
            mBindingLookup.insert(key, semitone);
        }
    };

    auto iter = mBindings.begin();
    // lower and upper rows (lower octave starts at 0, upper at 1)
    for (auto semitone : {0, 12}) {
        for (int i = 0; i < BindsPerRow; ++i) {
            mapKey(*iter++, semitone++);
        }
    }
    // specials
    int special = SPECIAL_START;
    while (iter != mBindings.end()) {
        mapKey(*iter++, special++);
    }

}